

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

void dgrminer::save_pattern
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               vector<int,_std::allocator<int>_> *graph_ids,results_crate *results,
               bool set_of_graphs,PartialUnion *pu,int pattern_support_absolute,
               double support_relative,
               set<int,_std::less<int>,_std::allocator<int>_> *antecedent_occurrences,
               double confidence,bool verbose)

{
  allocator<int> *this;
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  undefined1 local_188 [8];
  vector<int,_std::allocator<int>_> new_;
  undefined1 local_158 [8];
  vector<int,_std::allocator<int>_> occurrences_vector;
  int local_130;
  int local_12c;
  undefined1 local_128 [4];
  int j;
  set<int,_std::less<int>,_std::allocator<int>_> occurrences_set;
  array<int,_6UL> result_edge;
  array<int,_4UL> result_node_1;
  undefined1 local_c0 [8];
  array<int,_4UL> result_node;
  ulong local_a0;
  size_t i;
  undefined1 local_80 [8];
  set<int,_std::less<int>,_std::allocator<int>_> already_saved_node_ids;
  double dStack_48;
  bool verbose_local;
  double confidence_local;
  double support_relative_local;
  PartialUnion *pPStack_30;
  int pattern_support_absolute_local;
  PartialUnion *pu_local;
  results_crate *prStack_20;
  bool set_of_graphs_local;
  results_crate *results_local;
  vector<int,_std::allocator<int>_> *graph_ids_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list_local;
  
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = verbose;
  results->saved_instances = results->saved_instances + 1;
  dStack_48 = confidence;
  confidence_local = support_relative;
  support_relative_local._4_4_ = pattern_support_absolute;
  pPStack_30 = pu;
  pu_local._7_1_ = set_of_graphs;
  prStack_20 = results;
  results_local = (results_crate *)graph_ids;
  graph_ids_local = (vector<int,_std::allocator<int>_> *)edge_list;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80);
  debug_println<char[18],int,char[8],double,char[3],int,char[20],double>
            ((bool)(already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ &
                   1),(char (*) [18])"FREQUENT PATTERN ",&prStack_20->saved_instances,
             (char (*) [8])", SUP: ",&confidence_local,(char (*) [3])0x17c8cb,
             (int *)((long)&support_relative_local + 4),(char (*) [20])" INSTANCES), CONF: ",
             &stack0xffffffffffffffb8);
  i = (size_t)support_relative_local._4_4_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&prStack_20->support_absolute,&i);
  std::vector<double,_std::allocator<double>_>::push_back(&prStack_20->support,&confidence_local);
  if (0.0 <= dStack_48) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&prStack_20->confidence,&stack0xffffffffffffffb8);
  }
  local_a0 = 0;
  while( true ) {
    sVar1 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       graph_ids_local);
    if (sVar1 <= local_a0) break;
    pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_a0);
    pvVar3 = std::array<int,_10UL>::operator[](pvVar2,0);
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80,pvVar3);
    if (sVar4 == 0) {
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      pvVar3 = std::array<int,_10UL>::operator[](pvVar2,0);
      pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80,pvVar3);
      result_node._M_elems._8_8_ = pVar7.first._M_node;
      local_c0._0_4_ = prStack_20->saved_instances;
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      pvVar3 = std::array<int,_10UL>::operator[](pvVar2,0);
      local_c0._4_4_ = *pvVar3;
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      pvVar3 = std::array<int,_10UL>::operator[](pvVar2,2);
      result_node._M_elems[0] = *pvVar3;
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      pvVar3 = std::array<int,_10UL>::operator[](pvVar2,3);
      result_node._M_elems[1] = *pvVar3;
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (&prStack_20->result_nodes,(value_type *)local_c0);
    }
    pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_a0);
    pvVar3 = std::array<int,_10UL>::operator[](pvVar2,1);
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80,pvVar3);
    if (sVar4 == 0) {
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      pvVar3 = std::array<int,_10UL>::operator[](pvVar2,1);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80,pvVar3);
      result_edge._M_elems[4] = prStack_20->saved_instances;
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      pvVar3 = std::array<int,_10UL>::operator[](pvVar2,1);
      result_edge._M_elems[5] = *pvVar3;
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      std::array<int,_10UL>::operator[](pvVar2,7);
      pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
               operator[]((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                          graph_ids_local,local_a0);
      std::array<int,_10UL>::operator[](pvVar2,8);
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (&prStack_20->result_nodes,(value_type *)(result_edge._M_elems + 4));
    }
    occurrences_set._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         prStack_20->saved_instances;
    pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_a0);
    pvVar3 = std::array<int,_10UL>::operator[](pvVar2,0);
    occurrences_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *pvVar3;
    pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_a0);
    pvVar3 = std::array<int,_10UL>::operator[](pvVar2,1);
    result_edge._M_elems[0] = *pvVar3;
    pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_a0);
    pvVar3 = std::array<int,_10UL>::operator[](pvVar2,5);
    result_edge._M_elems[1] = *pvVar3;
    pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_a0);
    pvVar3 = std::array<int,_10UL>::operator[](pvVar2,4);
    result_edge._M_elems[2] = *pvVar3;
    pvVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        graph_ids_local,local_a0);
    pvVar3 = std::array<int,_10UL>::operator[](pvVar2,6);
    result_edge._M_elems[3] = *pvVar3;
    std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::push_back
              (&prStack_20->result_edges,
               (value_type *)&occurrences_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_a0 = local_a0 + 1;
  }
  if ((pu_local._7_1_ & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_188,
               (vector<int,_std::allocator<int>_> *)results_local);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&prStack_20->occurrences,(value_type *)local_188);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_188);
  }
  else {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    local_12c = 0;
    while( true ) {
      uVar5 = (ulong)local_12c;
      sVar1 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)results_local);
      if (sVar1 <= uVar5) break;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)results_local,(long)local_12c);
      local_130 = PartialUnion::queryMappingSnapshotsToGraphs(pu,*pvVar6);
      pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128,&local_130);
      occurrences_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pVar7.first._M_node;
      local_12c = local_12c + 1;
    }
    __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    this = (allocator<int> *)
           ((long)&new_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(this);
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)local_158,
               (_Rb_tree_const_iterator<int>)__first._M_node,
               (_Rb_tree_const_iterator<int>)__last._M_node,this);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&new_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&prStack_20->occurrences,(value_type *)local_158);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_158);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80);
  return;
}

Assistant:

void save_pattern(std::vector<std::array<int, 10>> &edge_list, std::vector<int> &graph_ids, results_crate * results,
                      bool set_of_graphs, PartialUnion pu, int pattern_support_absolute, double support_relative,
                      std::set<int> &antecedent_occurrences, double confidence = -1.0, bool verbose = false)
	{
		results->saved_instances++;

		std::set<int> already_saved_node_ids;
        debug_println(verbose, "FREQUENT PATTERN ", results->saved_instances, ", SUP: ", support_relative, " (",
                      pattern_support_absolute, " INSTANCES), CONF: ", confidence);

		results->support_absolute.push_back(pattern_support_absolute);
		results->support.push_back(support_relative);
		if (confidence >= 0)
		{
			results->confidence.push_back(confidence);
		}


		for (size_t i = 0; i < edge_list.size(); i++)
		{
			if (already_saved_node_ids.count(edge_list[i][0]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][0]);
				std::array<int, 4> result_node = { results->saved_instances, edge_list[i][0], edge_list[i][2], edge_list[i][3] };
				results->result_nodes.push_back(result_node);
			}
			if (already_saved_node_ids.count(edge_list[i][1]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][1]);
				std::array<int, 4> result_node = { results->saved_instances, edge_list[i][1], edge_list[i][7], edge_list[i][8] };
				results->result_nodes.push_back(result_node);
			}

			std::array<int, 6> result_edge = { results->saved_instances, edge_list[i][0], edge_list[i][1], edge_list[i][5], edge_list[i][4], edge_list[i][6] };
			results->result_edges.push_back(result_edge);
		}

		if (set_of_graphs)
		{
			std::set<int> occurrences_set;
			for (int j = 0; j < graph_ids.size(); j++)
			{
				occurrences_set.insert(pu.queryMappingSnapshotsToGraphs(graph_ids[j]));
			}
			std::vector<int> occurrences_vector(occurrences_set.begin(), occurrences_set.end());
			results->occurrences.push_back(occurrences_vector);
		}
		else
		{

			std::vector<int> new_(graph_ids);
			results->occurrences.push_back(new_);
		}
	}